

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 tcu::sampleLevelArray3DOffset
               (ConstPixelBufferAccess *levels,int numLevels,Sampler *sampler,float s,float t,
               float r,float lod,IVec3 *offset)

{
  int iVar1;
  int i_1;
  int iVar2;
  IVec3 *offset_00;
  FilterMode filter;
  Vector<float,_4> *res_2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  Sampler *sampler_00;
  int i;
  long lVar5;
  float fVar6;
  float fVar7;
  float in_XMM1_Db;
  Vec4 VVar8;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 t1;
  Vec4 t0;
  float local_78 [10];
  float local_50 [4];
  float local_40 [4];
  
  sampler_00 = (Sampler *)CONCAT44(in_register_00000034,numLevels);
  iVar1 = offset[1].m_data[lod <= (float)offset[1].m_data[2]];
  filter = (FilterMode)offset;
  switch(iVar1) {
  case 0:
    offset_00 = (IVec3 *)0x0;
    break;
  case 1:
    offset_00 = (IVec3 *)&DAT_00000001;
    break;
  case 2:
  case 4:
    iVar3 = (int)sampler + -1;
    fVar6 = ceilf(lod + 0.5);
    iVar4 = (int)fVar6 + -1;
    if (iVar4 < iVar3) {
      iVar3 = iVar4;
    }
    iVar2 = 0;
    if (-1 < iVar4) {
      iVar2 = iVar3;
    }
    offset_00 = (IVec3 *)(ulong)(iVar1 == 4);
    sampler_00 = (Sampler *)(&sampler_00->wrapS + (long)iVar2 * 10);
    break;
  case 3:
  case 5:
    iVar4 = (int)sampler + -1;
    fVar6 = floorf(lod);
    iVar2 = (int)fVar6;
    iVar3 = iVar4;
    if (iVar2 < iVar4) {
      iVar3 = iVar2;
    }
    lVar5 = 0;
    if (iVar2 < 0) {
      iVar3 = 0;
    }
    if (iVar3 + 1 <= iVar4) {
      iVar4 = iVar3 + 1;
    }
    ConstPixelBufferAccess::sample3DOffset
              ((ConstPixelBufferAccess *)local_40,(Sampler *)(&sampler_00->wrapS + (long)iVar3 * 10)
               ,filter,s,t,r,(IVec3 *)(ulong)(iVar1 == 5));
    ConstPixelBufferAccess::sample3DOffset
              ((ConstPixelBufferAccess *)local_50,(Sampler *)(&sampler_00->wrapS + (long)iVar4 * 10)
               ,filter,s,t,r,(IVec3 *)(ulong)(iVar1 == 5));
    local_78[4] = 0.0;
    local_78[5] = 0.0;
    local_78[6] = 0.0;
    local_78[7] = 0.0;
    do {
      in_XMM1_Db = 0.0;
      t = local_40[lVar5] * (1.0 - (lod - fVar6));
      local_78[lVar5 + 4] = t;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_78[0] = 0.0;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    local_78[3] = 0.0;
    lVar5 = 0;
    do {
      local_78[lVar5] = local_50[lVar5] * (lod - fVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    (levels->m_format).order = R;
    (levels->m_format).type = SNORM_INT8;
    (levels->m_size).m_data[0] = 0;
    (levels->m_size).m_data[1] = 0;
    lVar5 = 0;
    do {
      fVar7 = 0.0;
      fVar6 = local_78[lVar5 + 4] + local_78[lVar5];
      (levels->m_size).m_data[lVar5 + -2] = (int)fVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    goto LAB_00911134;
  default:
    fVar6 = 0.0;
    fVar7 = 0.0;
    (levels->m_format).order = R;
    (levels->m_format).type = SNORM_INT8;
    (levels->m_size).m_data[0] = 0;
    (levels->m_size).m_data[1] = 0;
    goto LAB_00911134;
  }
  VVar8 = ConstPixelBufferAccess::sample3DOffset(levels,sampler_00,filter,s,t,r,offset_00);
  t = VVar8.m_data[2];
  in_XMM1_Db = VVar8.m_data[3];
  fVar6 = VVar8.m_data[0];
  fVar7 = VVar8.m_data[1];
LAB_00911134:
  VVar8.m_data[1] = fVar7;
  VVar8.m_data[0] = fVar6;
  VVar8.m_data[3] = in_XMM1_Db;
  VVar8.m_data[2] = t;
  return (Vec4)VVar8.m_data;
}

Assistant:

Vec4 sampleLevelArray3DOffset (const ConstPixelBufferAccess* levels, int numLevels, const Sampler& sampler, float s, float t, float r, float lod, const IVec3& offset)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:	return levels[0].sample3DOffset(sampler, filterMode, s, t, r, offset);
		case Sampler::LINEAR:	return levels[0].sample3DOffset(sampler, filterMode, s, t, r, offset);

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			return levels[level].sample3DOffset(sampler, levelFilter, s, t, r, offset);
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int					level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float				f			= deFloatFrac(lod);
			tcu::Vec4			t0			= levels[level0].sample3DOffset(sampler, levelFilter, s, t, r, offset);
			tcu::Vec4			t1			= levels[level1].sample3DOffset(sampler, levelFilter, s, t, r, offset);

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}